

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

void luaV_arith(lua_State *L,StkId ra,TValue *rb,TValue *rc,TMS op)

{
  int iVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  TValue *io;
  lua_Number lVar4;
  TValue tempc;
  TValue tempb;
  TValue local_50;
  TValue local_40;
  
  pTVar2 = luaV_tonumber(rb,&local_40);
  if ((pTVar2 != (TValue *)0x0) && (pTVar3 = luaV_tonumber(rc,&local_50), pTVar3 != (TValue *)0x0))
  {
    lVar4 = luaO_arith(op - TM_ADD,(pTVar2->value_).n,(pTVar3->value_).n);
    (ra->value_).n = lVar4;
    ra->tt_ = 3;
    return;
  }
  iVar1 = call_binTM(L,rb,rc,ra,op);
  if (iVar1 != 0) {
    return;
  }
  luaG_aritherror(L,rb,rc);
}

Assistant:

void luaV_arith (lua_State *L, StkId ra, const TValue *rb,
                 const TValue *rc, TMS op) {
  TValue tempb, tempc;
  const TValue *b, *c;
  if ((b = luaV_tonumber(rb, &tempb)) != NULL &&
      (c = luaV_tonumber(rc, &tempc)) != NULL) {
    lua_Number res = luaO_arith(op - TM_ADD + LUA_OPADD, nvalue(b), nvalue(c));
    setnvalue(ra, res);
  }
  else if (!call_binTM(L, rb, rc, ra, op))
    luaG_aritherror(L, rb, rc);
}